

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internaltypes.cpp
# Opt level: O0

void __thiscall
libcellml::HistoryEpoch::setReferenceName(HistoryEpoch *this,ImportedEntityConstPtr *importedEntity)

{
  bool bVar1;
  element_type *peVar2;
  string local_38;
  __shared_ptr_access<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_18;
  ImportedEntityConstPtr *importedEntity_local;
  HistoryEpoch *this_local;
  
  local_18 = (__shared_ptr_access<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)importedEntity;
  importedEntity_local = (ImportedEntityConstPtr *)this;
  peVar2 = std::
           __shared_ptr_access<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)importedEntity);
  bVar1 = ImportedEntity::isImport(peVar2);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_18);
    ImportedEntity::importReference_abi_cxx11_(&local_38,peVar2);
    std::__cxx11::string::operator=((string *)&this->mReferenceName,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void HistoryEpoch::setReferenceName(const ImportedEntityConstPtr &importedEntity)
{
    if (importedEntity->isImport()) {
        mReferenceName = importedEntity->importReference();
    }
}